

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall SmallArray<ModuleData_*,_32U>::~SmallArray(SmallArray<ModuleData_*,_32U> *this)

{
  ModuleData **ppMVar1;
  
  ppMVar1 = this->data;
  if (ppMVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppMVar1 != (ModuleData **)0x0) {
        (*(code *)NULLC::dealloc)(ppMVar1);
      }
    }
    else if (ppMVar1 != (ModuleData **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}